

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O0

int64_t __thiscall
anon_unknown.dwarf_18c56::OpenGLGraphicsPlugin::SelectColorSwapchainFormat
          (OpenGLGraphicsPlugin *this,vector<long,_std::allocator<long>_> *runtimeFormats)

{
  bool bVar1;
  long *__first2;
  long *__last2;
  reference plVar2;
  allocator local_79;
  string local_78 [32];
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_58;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_50;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_48;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_40;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> swapchainFormatIt;
  int64_t SupportedColorSwapchainFormats [4];
  vector<long,_std::allocator<long>_> *runtimeFormats_local;
  OpenGLGraphicsPlugin *this_local;
  
  swapchainFormatIt._M_current = (long *)0x8059;
  local_48._M_current = (long *)std::vector<long,_std::allocator<long>_>::begin(runtimeFormats);
  local_50._M_current = (long *)std::vector<long,_std::allocator<long>_>::end(runtimeFormats);
  __first2 = std::begin<long_const,4ul>((long (*) [4])&swapchainFormatIt);
  __last2 = std::end<long_const,4ul>((long (*) [4])&swapchainFormatIt);
  local_40 = std::
             find_first_of<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long_const*>
                       (local_48,local_50,__first2,__last2);
  local_58._M_current = (long *)std::vector<long,_std::allocator<long>_>::end(runtimeFormats);
  bVar1 = __gnu_cxx::operator==(&local_40,&local_58);
  if (!bVar1) {
    plVar2 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&local_40);
    return *plVar2;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"No runtime swapchain format supported for color swapchain",&local_79);
  Throw((string *)local_78,(char *)0x0,
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:246"
       );
}

Assistant:

int64_t SelectColorSwapchainFormat(const std::vector<int64_t>& runtimeFormats) const override {
        // List of supported color swapchain formats.
        constexpr int64_t SupportedColorSwapchainFormats[] = {
            GL_RGB10_A2,
            GL_RGBA16F,
            // The two below should only be used as a fallback, as they are linear color formats without enough bits for color
            // depth, thus leading to banding.
            GL_RGBA8,
            GL_RGBA8_SNORM,
        };

        auto swapchainFormatIt =
            std::find_first_of(runtimeFormats.begin(), runtimeFormats.end(), std::begin(SupportedColorSwapchainFormats),
                               std::end(SupportedColorSwapchainFormats));
        if (swapchainFormatIt == runtimeFormats.end()) {
            THROW("No runtime swapchain format supported for color swapchain");
        }

        return *swapchainFormatIt;
    }